

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O3

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [32];
  long lVar15;
  uint *puVar16;
  long lVar17;
  ulong *puVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  float *pfVar23;
  float *pfVar24;
  ulong *puVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  iVar5 = bottom_blob->c;
  if (0 < (long)iVar5) {
    iVar6 = top_blob->w;
    uVar7 = top_blob->h;
    lVar28 = (long)bottom_blob->w;
    lVar1 = lVar28 + 2;
    pvVar8 = top_blob->data;
    sVar9 = top_blob->cstep;
    sVar10 = top_blob->elemsize;
    pvVar11 = bottom_blob->data;
    sVar12 = bottom_blob->cstep;
    sVar13 = bottom_blob->elemsize;
    lVar19 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar29 = 0.0;
      }
      else {
        fVar29 = *(float *)((long)&_bias->data + lVar19 * 4);
      }
      pfVar23 = (float *)(sVar9 * sVar10 * lVar19 + (long)pvVar8);
      puVar25 = (ulong *)(sVar12 * sVar13 * lVar19 + (long)pvVar11);
      lVar15 = lVar19 * 0x24;
      puVar16 = (uint *)(lVar28 * 4 + (long)puVar25);
      puVar18 = puVar25 + lVar28;
      pfVar24 = pfVar23;
      uVar20 = 0;
      if (1 < (int)uVar7) {
        lVar22 = lVar28 * 0xc + (long)puVar25;
        iVar26 = 0;
        do {
          pfVar23 = pfVar23 + iVar6;
          if (0 < iVar6) {
            lVar17 = 0;
            uVar20 = iVar6 + 1U;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)((long)puVar25 + lVar17 + 4);
              auVar32 = vmovlhps_avx(ZEXT416(*(uint *)((long)puVar25 + lVar17)),auVar30);
              auVar32 = vshufps_avx(auVar32,auVar30,0xd8);
              auVar33 = vinsertps_avx(auVar32,ZEXT416((uint)*(float *)((long)puVar16 + lVar17)),0x30
                                     );
              pfVar2 = (float *)((long)&_kernel->elemsize + lVar15);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)puVar16 + lVar17 + 4);
              auVar32 = vinsertps_avx(auVar38,ZEXT416(*(uint *)((long)puVar18 + lVar17)),0x20);
              auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)((long)puVar18 + lVar17 + 4)),0x30);
              auVar40._0_4_ = *pfVar2 * auVar32._0_4_;
              auVar40._4_4_ = pfVar2[1] * auVar32._4_4_;
              auVar40._8_4_ = pfVar2[2] * auVar32._8_4_;
              auVar40._12_4_ = pfVar2[3] * auVar32._12_4_;
              auVar30 = vhaddps_avx(auVar40,auVar40);
              auVar32 = *(undefined1 (*) [16])((long)&_kernel->data + lVar15);
              auVar30 = vhaddps_avx(auVar30,auVar30);
              auVar35._0_4_ = auVar32._0_4_ * auVar33._0_4_;
              auVar35._4_4_ = auVar32._4_4_ * auVar33._4_4_;
              auVar35._8_4_ = auVar32._8_4_ * auVar33._8_4_;
              auVar35._12_4_ = auVar32._12_4_ * auVar33._12_4_;
              auVar33 = vhaddps_avx(auVar35,auVar35);
              fVar3 = *(float *)((long)&_kernel->allocator + lVar15);
              auVar33 = vhaddps_avx(auVar33,auVar33);
              auVar35 = vmovlhps_avx(auVar32,auVar38);
              auVar35 = vshufps_avx(auVar35,auVar38,0xd8);
              auVar38 = vinsertps_avx(auVar35,ZEXT416(*(uint *)((long)puVar18 + lVar17)),0x30);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)puVar18 + lVar17 + 4);
              auVar35 = vmovhps_avx(auVar39,*(undefined8 *)(lVar22 + lVar17));
              fVar4 = *(float *)(lVar22 + 8 + lVar17);
              auVar37._0_4_ = auVar35._0_4_ * *pfVar2;
              auVar37._4_4_ = auVar35._4_4_ * pfVar2[1];
              auVar37._8_4_ = auVar35._8_4_ * pfVar2[2];
              auVar37._12_4_ = auVar35._12_4_ * pfVar2[3];
              auVar35 = vhaddps_avx(auVar37,auVar37);
              auVar35 = vhaddps_avx(auVar35,auVar35);
              auVar31._0_4_ = auVar38._0_4_ * *(float *)((long)puVar16 + lVar17);
              auVar31._4_4_ = auVar38._4_4_ * auVar32._4_4_;
              auVar31._8_4_ = auVar38._8_4_ * auVar32._8_4_;
              auVar31._12_4_ = auVar38._12_4_ * auVar32._12_4_;
              auVar32 = vhaddps_avx(auVar31,auVar31);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              *(float *)((long)pfVar24 + lVar17) =
                   auVar30._0_4_ +
                   fVar3 * *(float *)((long)puVar18 + lVar17 + 8) + auVar33._0_4_ + fVar29;
              *(float *)((long)pfVar23 + lVar17) =
                   fVar3 * fVar4 + auVar35._0_4_ + auVar32._0_4_ + fVar29;
              lVar17 = lVar17 + 4;
              uVar20 = uVar20 - 1;
            } while (1 < uVar20);
            pfVar24 = (float *)((long)pfVar24 + lVar17);
            pfVar23 = (float *)((long)pfVar23 + lVar17);
            puVar25 = (ulong *)((long)puVar25 + lVar17);
            puVar16 = (uint *)((long)puVar16 + lVar17);
            puVar18 = (ulong *)((long)puVar18 + lVar17);
            lVar22 = lVar22 + lVar17;
          }
          puVar25 = (ulong *)((long)puVar25 + lVar1 * 4);
          puVar16 = puVar16 + lVar1;
          puVar18 = (ulong *)((long)puVar18 + lVar1 * 4);
          lVar22 = lVar22 + lVar1 * 4;
          pfVar24 = pfVar24 + iVar6;
          iVar27 = iVar26 + 3;
          iVar26 = iVar26 + 2;
          uVar20 = uVar7 & 0xfffffffe;
        } while (iVar27 < (int)uVar7);
      }
      if ((int)uVar20 < (int)uVar7) {
        do {
          uVar21 = iVar6 + 1U;
          if (0 < iVar6) {
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *puVar25;
              auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)puVar25[1]),0x20);
              auVar32 = vinsertps_avx(auVar32,ZEXT416(*puVar16),0x30);
              auVar36._16_8_ = *(undefined8 *)(puVar16 + 1);
              auVar36._0_16_ = auVar32;
              auVar36._24_8_ = 0;
              auVar34._16_8_ = *puVar18;
              auVar34._0_16_ = auVar32;
              auVar34._24_8_ = 0;
              auVar34 = vshufpd_avx(auVar36,auVar34,2);
              pfVar23 = (float *)((long)&_kernel->data + lVar15);
              auVar33._0_4_ = auVar34._0_4_ * *pfVar23;
              auVar33._4_4_ = auVar34._4_4_ * pfVar23[1];
              auVar33._8_4_ = auVar34._8_4_ * pfVar23[2];
              auVar33._12_4_ = auVar34._12_4_ * pfVar23[3];
              auVar14._16_4_ = auVar34._16_4_ * pfVar23[4];
              auVar14._0_16_ = auVar33;
              auVar14._20_4_ = auVar34._20_4_ * pfVar23[5];
              auVar14._24_4_ = auVar34._24_4_ * pfVar23[6];
              auVar14._28_4_ = auVar34._28_4_;
              pfVar23 = (float *)(puVar18 + 1);
              auVar32 = vhaddps_avx(auVar14._16_16_,auVar33);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              puVar25 = (ulong *)((long)puVar25 + 4);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              puVar16 = puVar16 + 1;
              puVar18 = (ulong *)((long)puVar18 + 4);
              *pfVar24 = *(float *)((long)&_kernel->allocator + lVar15) * *pfVar23 + fVar29 +
                         auVar32._0_4_;
              pfVar24 = pfVar24 + 1;
              uVar21 = uVar21 - 1;
            } while (1 < uVar21);
          }
          puVar25 = puVar25 + 1;
          puVar16 = puVar16 + 2;
          puVar18 = puVar18 + 1;
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar7);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar5);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;
        const float* r3 = img0 + w * 3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i + 1 < outh; i += 2)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}